

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O2

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  uint uVar1;
  cs_mode cVar2;
  DecodeStatus DVar3;
  uint16_t uVar4;
  cs_insn *Address;
  uint32_t insn;
  int feature;
  
  feature = (int)size;
  uVar4 = 0;
  DVar3 = MCDisassembler_Fail;
  if (code_len < 4) goto LAB_0020883e;
  cVar2 = instr->csh->mode;
  if (cVar2 < CS_MODE_ARM) {
    uVar1 = *(uint *)code;
    insn = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  else {
    insn = *(uint32_t *)code;
  }
  Address = instr->flat_insn;
  if (Address->detail != (cs_detail *)0x0) {
    memset(Address->detail,0,0x128);
    cVar2 = instr->csh->mode;
  }
  if ((cVar2 & CS_MODE_M680X_6801) == CS_MODE_ARM) {
LAB_00208817:
    DVar3 = decodeInstruction_4("\x01\x1a\x06\x02",instr,insn,(uint64_t)Address,feature);
    if (DVar3 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      uVar4 = 0;
      DVar3 = MCDisassembler_Fail;
      goto LAB_0020883e;
    }
  }
  else {
    DVar3 = decodeInstruction_4(DecoderTableQPX32,instr,insn,(uint64_t)Address,feature);
    if (DVar3 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      goto LAB_00208817;
    }
  }
  uVar4 = 4;
LAB_0020883e:
  *size = uVar4;
  return DVar3 == MCDisassembler_Success;
}

Assistant:

bool PPC_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = getInstruction(instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}